

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryNeg(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  EmitExpressionInfo EVar1;
  bool bVar2;
  AsmJsCompilationException *pAVar3;
  AsmJsType local_64;
  RegSlot local_60;
  AsmJsType local_5c;
  RegSlot dst_2;
  AsmJsType local_54;
  RegSlot dst_1;
  RegSlot dst;
  AsmJsType *local_40;
  AsmJsType *rType;
  EmitExpressionInfo *local_30;
  EmitExpressionInfo *rhsEmit;
  ParseNode *rhs;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  rhs = pnode;
  pnode_local = (ParseNode *)this;
  rhsEmit = (EmitExpressionInfo *)ParserWrapper::GetUnaryNode(pnode);
  rType = (AsmJsType *)Emit(this,(ParseNode *)rhsEmit);
  local_30 = (EmitExpressionInfo *)&rType;
  local_40 = (AsmJsType *)((long)&rType + 4);
  StartStatement(this,rhs);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local);
  bVar2 = AsmJsType::isInt(local_40);
  if (bVar2) {
    bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,local_30);
    if (!bVar2) {
      pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar3,L"Invalid Node location[%d] ",(ulong)(local_30->super_EmitInfoBase).location
                );
      __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
    }
    dst_1 = GetAndReleaseUnaryLocations<int>(this,local_30);
    AsmJsType::AsmJsType(&local_54,Intish);
    this_local._4_4_ = local_54.which_;
    AsmJsByteCodeWriter::AsmReg2
              (&this->mWriter,Neg_Int,dst_1,(local_30->super_EmitInfoBase).location);
    this_local._0_4_ = dst_1;
  }
  else {
    bVar2 = AsmJsType::isMaybeDouble(local_40);
    if (bVar2) {
      bVar2 = AsmJsFunc::IsValidLocation<double>(this->mFunction,local_30);
      if (!bVar2) {
        pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar3,L"Invalid Node location[%d] ",
                   (ulong)(local_30->super_EmitInfoBase).location);
        __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
      }
      dst_2 = GetAndReleaseUnaryLocations<double>(this,local_30);
      AsmJsType::AsmJsType(&local_5c,Double);
      this_local._4_4_ = local_5c.which_;
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Neg_Db,dst_2,(local_30->super_EmitInfoBase).location);
      this_local._0_4_ = dst_2;
    }
    else {
      bVar2 = AsmJsType::isMaybeFloat(local_40);
      if (!bVar2) {
        pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar3,L"Type not supported for unary -");
        __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsFunc::IsValidLocation<float>(this->mFunction,local_30);
      if (!bVar2) {
        pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar3,L"Invalid Node location[%d] ",
                   (ulong)(local_30->super_EmitInfoBase).location);
        __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
      }
      local_60 = GetAndReleaseUnaryLocations<float>(this,local_30);
      AsmJsType::AsmJsType(&local_64,Floatish);
      this_local._4_4_ = local_64.which_;
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Neg_Flt,local_60,(local_30->super_EmitInfoBase).location);
      this_local._0_4_ = local_60;
    }
  }
  EndStatement(this,rhs);
  EVar1.type.which_ = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryNeg( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo;
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            emitInfo.type = AsmJsType::Intish;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Int, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeDouble())
        {
            CheckNodeLocation( rhsEmit, double );
            RegSlot dst = GetAndReleaseUnaryLocations<double>( &rhsEmit );
            emitInfo.type = AsmJsType::Double;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Db, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeFloat())
        {
            CheckNodeLocation(rhsEmit, float);
            RegSlot dst = GetAndReleaseUnaryLocations<float>(&rhsEmit);
            emitInfo.type = AsmJsType::Floatish;
            mWriter.AsmReg2(OpCodeAsmJs::Neg_Flt, dst, rhsEmit.location);
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary -") );
        }
        EndStatement(pnode);
        return emitInfo;
    }